

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

string_view __thiscall
bloaty::anon_unknown_0::ElfFile::GetRegion(ElfFile *this,uint64_t start,uint64_t n)

{
  size_t in_R8;
  string_view sVar1;
  
  sVar1._M_str = (char *)start;
  sVar1._M_len = (size_t)(this->data_)._M_str;
  sVar1 = StrictSubstr((bloaty *)(this->data_)._M_len,sVar1,n,in_R8);
  return sVar1;
}

Assistant:

string_view GetRegion(uint64_t start, uint64_t n) const {
    return StrictSubstr(data_, start, n);
  }